

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>::
emplaceValue<QXmlStreamReaderPrivate::Entity>
          (Node<QStringView,_QXmlStreamReaderPrivate::Entity> *this,Entity *args)

{
  long lVar1;
  Entity *in_RDI;
  long in_FS_OFFSET;
  Entity *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReaderPrivate::Entity::Entity(in_RDI,in_stack_ffffffffffffff98);
  QXmlStreamReaderPrivate::Entity::operator=(in_RDI,in_stack_ffffffffffffff98);
  QXmlStreamReaderPrivate::Entity::~Entity(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }